

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QString *labelText,QLayout *field)

{
  bool bVar1;
  QWidget *label;
  
  if (field != (QLayout *)0x0) {
    bVar1 = QLayoutPrivate::checkLayout(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,field);
    if (!bVar1) {
      return;
    }
  }
  if ((labelText->d).size == 0) {
    label = (QWidget *)0x0;
  }
  else {
    label = (QWidget *)operator_new(0x28);
    QLabel::QLabel((QLabel *)label,labelText,(QWidget *)0x0,(WindowFlags)0x0);
  }
  insertRow(this,row,label,field);
  return;
}

Assistant:

void QFormLayout::insertRow(int row, const QString &labelText, QLayout *field)
{
    Q_D(QFormLayout);
    if (field && !d->checkLayout(field))
        return;

    insertRow(row, labelText.isEmpty() ? nullptr : new QLabel(labelText), field);
}